

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::setActiveSubWindow(QMdiArea *this,QMdiSubWindow *window)

{
  bool bVar1;
  QMdiAreaPrivate *this_00;
  qsizetype qVar2;
  long in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiAreaPrivate *d;
  QMdiSubWindow **in_stack_ffffffffffffff98;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QMdiSubWindow *in_stack_ffffffffffffffb8;
  char local_30 [32];
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  this_00 = d_func((QMdiArea *)0x6134ba);
  if (local_10 == 0) {
    QMdiAreaPrivate::activateWindow(in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x6134eb);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffb0,(char *)in_RDI,(int)((ulong)this_00 >> 0x20),
                 (char *)in_stack_ffffffffffffff98);
      QMessageLogger::warning(local_30,"QMdiArea::setActiveSubWindow: workspace is empty");
    }
    else {
      qVar2 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                        ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)this_00,
                         in_stack_ffffffffffffff98,0x613537);
      if (qVar2 == -1) {
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffffb0,(char *)in_RDI,(int)((ulong)this_00 >> 0x20),
                   (char *)in_stack_ffffffffffffff98);
        QMessageLogger::warning
                  (&stack0xffffffffffffffb0,
                   "QMdiArea::setActiveSubWindow: window is not inside workspace");
      }
      else {
        QMdiAreaPrivate::activateWindow(in_RDI,in_stack_ffffffffffffffb8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::setActiveSubWindow(QMdiSubWindow *window)
{
    Q_D(QMdiArea);
    if (!window) {
        d->activateWindow(nullptr);
        return;
    }

    if (Q_UNLIKELY(d->childWindows.isEmpty())) {
        qWarning("QMdiArea::setActiveSubWindow: workspace is empty");
        return;
    }

    if (Q_UNLIKELY(d->childWindows.indexOf(window) == -1)) {
        qWarning("QMdiArea::setActiveSubWindow: window is not inside workspace");
        return;
    }

    d->activateWindow(window);
}